

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

String * __thiscall
kj::stringifyStackTrace(String *__return_storage_ptr__,kj *this,ArrayPtr<void_*const> trace)

{
  int iVar1;
  __pid_t _Var2;
  ExceptionCallback *pEVar3;
  char *pcVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  _func_int **delim;
  size_t extraout_RDX;
  String *params_2;
  String *in_R9;
  size_t sVar7;
  long lVar8;
  StringPtr filename;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:248:3)>
  _kjDefer248;
  String oldPreload;
  Array<char> local_598;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:257:3)>
  _kjDefer257;
  ArrayPtr<const_char> local_570;
  ArrayPtr<void_*const> trace_local;
  String strTrace;
  char line [512];
  String lines [32];
  
  trace_local.size_ = (size_t)trace.ptr;
  if ((void **)trace_local.size_ == (void **)0x0) {
LAB_002664ea:
    (__return_storage_ptr__->content).ptr = (char *)0x0;
    (__return_storage_ptr__->content).size_ = 0;
    (__return_storage_ptr__->content).disposer = (ArrayDisposer *)0x0;
    return __return_storage_ptr__;
  }
  trace_local.ptr = (void **)this;
  pEVar3 = getExceptionCallback();
  delim = pEVar3->_vptr_ExceptionCallback;
  iVar1 = (*delim[5])(pEVar3);
  if (iVar1 != 0) goto LAB_002664ea;
  pthread_mutex_lock((pthread_mutex_t *)&stringifyStackTrace::mutex);
  _kjDefer248.canceled = false;
  pcVar4 = getenv("LD_PRELOAD");
  oldPreload.content.ptr = (char *)0x0;
  oldPreload.content.size_ = 0;
  oldPreload.content.disposer = (ArrayDisposer *)0x0;
  if (pcVar4 != (char *)0x0) {
    heapString(lines,pcVar4);
    Array<char>::operator=(&oldPreload.content,&lines[0].content);
    Array<char>::~Array(&lines[0].content);
    unsetenv("LD_PRELOAD");
  }
  _kjDefer257.func.oldPreload = &oldPreload;
  _kjDefer257.canceled = false;
  memset(lines,0,0x300);
  strArray<kj::ArrayPtr<void*const>&>
            (&strTrace,(kj *)&trace_local,(ArrayPtr<void_*const> *)0x2ae735,(char *)delim);
  iVar1 = access("/proc/self/exe",4);
  if (-1 < iVar1) {
    _Var2 = getpid();
    local_598.ptr = (char *)CONCAT44(local_598.ptr._4_4_,_Var2);
    pcVar4 = "/exe ";
    params_2 = &strTrace;
    str<char_const(&)[20],int,char_const(&)[6],kj::String&>
              ((String *)line,(kj *)"addr2line -e /proc/",(char (*) [20])&local_598,(int *)"/exe ",
               (char (*) [6])params_2,in_R9);
    if (line._8_8_ == 0) {
      line._0_8_ = "";
    }
    __stream = popen((char *)line._0_8_,"r");
    Array<char>::~Array((Array<char> *)line);
    if (__stream != (FILE *)0x0) {
      for (sVar7 = 0; sVar7 != 0x20; sVar7 = sVar7 + 1) {
        do {
          pcVar5 = fgets(line,0x200,__stream);
          if (pcVar5 == (char *)0x0) goto LAB_00266780;
          pcVar5 = strstr(line,"kj/common.c++");
        } while (((((pcVar5 != (char *)0x0) ||
                   (pcVar5 = strstr(line,"kj/exception."), pcVar5 != (char *)0x0)) ||
                  (pcVar5 = strstr(line,"kj/debug."), pcVar5 != (char *)0x0)) ||
                 ((pcVar5 = strstr(line,"kj/async."), pcVar5 != (char *)0x0 ||
                  (pcVar5 = strstr(line,"kj/async-prelude.h"), pcVar5 != (char *)0x0)))) ||
                ((pcVar5 = strstr(line,"kj/async-inl.h"), pcVar5 != (char *)0x0 ||
                 ((pcVar5 = strstr(line,"kj::Exception"), pcVar5 != (char *)0x0 ||
                  (pcVar5 = strstr(line,"kj::_::Debug"), pcVar5 != (char *)0x0))))));
        sVar6 = strlen(line);
        if ((sVar6 != 0) && (*(char *)((sVar6 - 1) + (long)line) == '\n')) {
          line[sVar6 - 1] = '\0';
        }
        sVar6 = strlen(line);
        filename.content.size_ = extraout_RDX;
        filename.content.ptr = (char *)(sVar6 + 1);
        local_570 = (ArrayPtr<const_char>)trimSourceFilename((kj *)line,filename);
        pcVar4 = ": returning here";
        str<char_const(&)[6],kj::StringPtr,char_const(&)[17]>
                  ((String *)&local_598,(kj *)"\n    ",(char (*) [6])&local_570,
                   (StringPtr *)": returning here",(char (*) [17])params_2);
        Array<char>::operator=(&lines[sVar7].content,&local_598);
        Array<char>::~Array(&local_598);
      }
LAB_00266780:
      do {
        pcVar5 = fgets(line,0x200,__stream);
      } while (pcVar5 != (char *)0x0);
      pclose(__stream);
      local_598.ptr = (char *)lines;
      local_598.size_ = sVar7;
      strArray<kj::ArrayPtr<kj::String>>
                (__return_storage_ptr__,(kj *)&local_598,(ArrayPtr<kj::String> *)0x2b02ed,pcVar4);
      goto LAB_002667d2;
    }
  }
  (__return_storage_ptr__->content).ptr = (char *)0x0;
  (__return_storage_ptr__->content).size_ = 0;
  (__return_storage_ptr__->content).disposer = (ArrayDisposer *)0x0;
LAB_002667d2:
  Array<char>::~Array(&strTrace.content);
  lVar8 = 0x2e8;
  do {
    Array<char>::~Array((Array<char> *)((long)&lines[0].content.ptr + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++:257:3)>
  ::~Deferred(&_kjDefer257);
  Array<char>::~Array(&oldPreload.content);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++:248:3)>
  ::~Deferred(&_kjDefer248);
  return __return_storage_ptr__;
}

Assistant:

String stringifyStackTrace(ArrayPtr<void* const> trace) {
  if (trace.size() == 0) return nullptr;
  if (getExceptionCallback().stackTraceMode() != ExceptionCallback::StackTraceMode::FULL) {
    return nullptr;
  }

#if _WIN32 && _M_X64 && _MSC_VER

  // Try to get file/line using SymGetLineFromAddr64(). We don't bother if we aren't on MSVC since
  // this requires MSVC debug info.
  //
  // TODO(someday): We could perhaps shell out to addr2line on MinGW.

  const Dbghelp& dbghelp = getDbghelp();
  if (dbghelp.symGetLineFromAddr64 == nullptr) return nullptr;

  HANDLE process = GetCurrentProcess();

  KJ_STACK_ARRAY(String, lines, trace.size(), 32, 32);

  for (auto i: kj::indices(trace)) {
    IMAGEHLP_LINE64 lineInfo;
    memset(&lineInfo, 0, sizeof(lineInfo));
    lineInfo.SizeOfStruct = sizeof(lineInfo);
    if (dbghelp.symGetLineFromAddr64(process, reinterpret_cast<DWORD64>(trace[i]), NULL, &lineInfo)) {
      lines[i] = kj::str('\n', lineInfo.FileName, ':', lineInfo.LineNumber);
    }
  }

  return strArray(lines, "");

#elif (__linux__ || __APPLE__) && !__ANDROID__
  // We want to generate a human-readable stack trace.

  // TODO(someday):  It would be really great if we could avoid farming out to another process
  //   and do this all in-process, but that may involve onerous requirements like large library
  //   dependencies or using -rdynamic.

  // The environment manipulation is not thread-safe, so lock a mutex.  This could still be
  // problematic if another thread is manipulating the environment in unrelated code, but there's
  // not much we can do about that.  This is debug-only anyway and only an issue when LD_PRELOAD
  // is in use.
  static pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
  pthread_mutex_lock(&mutex);
  KJ_DEFER(pthread_mutex_unlock(&mutex));

  // Don't heapcheck / intercept syscalls.
  const char* preload = getenv("LD_PRELOAD");
  String oldPreload;
  if (preload != nullptr) {
    oldPreload = heapString(preload);
    unsetenv("LD_PRELOAD");
  }
  KJ_DEFER(if (oldPreload != nullptr) { setenv("LD_PRELOAD", oldPreload.cStr(), true); });

  String lines[32];
  FILE* p = nullptr;
  auto strTrace = strArray(trace, " ");

#if __linux__
  if (access("/proc/self/exe", R_OK) < 0) {
    // Apparently /proc is not available?
    return nullptr;
  }

  // Obtain symbolic stack trace using addr2line.
  // TODO(cleanup): Use fork() and exec() or maybe our own Subprocess API (once it exists), to
  //   avoid depending on a shell.
  p = popen(str("addr2line -e /proc/", getpid(), "/exe ", strTrace).cStr(), "r");
#elif __APPLE__
  // The Mac OS X equivalent of addr2line is atos.
  // (Internally, it uses the private CoreSymbolication.framework library.)
  p = popen(str("xcrun atos -p ", getpid(), ' ', strTrace).cStr(), "r");
#endif

  if (p == nullptr) {
    return nullptr;
  }

  char line[512];
  size_t i = 0;
  while (i < kj::size(lines) && fgets(line, sizeof(line), p) != nullptr) {
    // Don't include exception-handling infrastructure or promise infrastructure in stack trace.
    // addr2line output matches file names; atos output matches symbol names.
    if (strstr(line, "kj/common.c++") != nullptr ||
        strstr(line, "kj/exception.") != nullptr ||
        strstr(line, "kj/debug.") != nullptr ||
        strstr(line, "kj/async.") != nullptr ||
        strstr(line, "kj/async-prelude.h") != nullptr ||
        strstr(line, "kj/async-inl.h") != nullptr ||
        strstr(line, "kj::Exception") != nullptr ||
        strstr(line, "kj::_::Debug") != nullptr) {
      continue;
    }

    size_t len = strlen(line);
    if (len > 0 && line[len-1] == '\n') line[len-1] = '\0';
    lines[i++] = str("\n    ", trimSourceFilename(line), ": returning here");
  }

  // Skip remaining input.
  while (fgets(line, sizeof(line), p) != nullptr) {}

  pclose(p);

  return strArray(arrayPtr(lines, i), "");

#else
  return nullptr;
#endif
}